

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O2

ResourceReference *
dxil_spv::get_resource_reference
          (Impl *impl,ResourceType resource_type,CallInst *instruction,uint resource_range)

{
  mapped_type *pmVar1;
  CallInst *local_8;
  
  if (resource_range == 0xffffffff) {
    local_8 = instruction;
    pmVar1 = std::__detail::
             _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->llvm_annotate_handle_uses,(key_type *)&local_8);
    return &pmVar1->reference;
  }
  if (resource_type == UAV) {
    return (impl->uav_index_to_reference).
           super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
           ._M_impl.super__Vector_impl_data._M_start + resource_range;
  }
  if (resource_type == CBV) {
    return (impl->cbv_index_to_reference).
           super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
           ._M_impl.super__Vector_impl_data._M_start + resource_range;
  }
  if (resource_type == Sampler) {
    return (impl->sampler_index_to_reference).
           super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
           ._M_impl.super__Vector_impl_data._M_start + resource_range;
  }
  return (impl->srv_index_to_reference).
         super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
         ._M_impl.super__Vector_impl_data._M_start + resource_range;
}

Assistant:

static Converter::Impl::ResourceReference &get_resource_reference(
		Converter::Impl &impl, DXIL::ResourceType resource_type,
		const llvm::CallInst *instruction, unsigned resource_range)
{
	if (resource_range == UINT32_MAX)
	{
		return impl.llvm_annotate_handle_uses[instruction].reference;
	}
	else
	{
		switch (resource_type)
		{
		default:
		case DXIL::ResourceType::SRV:
			return impl.srv_index_to_reference[resource_range];
		case DXIL::ResourceType::UAV:
			return impl.uav_index_to_reference[resource_range];
		case DXIL::ResourceType::CBV:
			return impl.cbv_index_to_reference[resource_range];
		case DXIL::ResourceType::Sampler:
			return impl.sampler_index_to_reference[resource_range];
		}
	}
}